

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_alignment.cc
# Opt level: O2

bool __thiscall s2polyline_alignment::Window::IsValid(Window *this)

{
  int iVar1;
  int iVar2;
  pointer pCVar3;
  bool bVar4;
  ColumnStride *curr;
  pointer pCVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  
  if ((((this->rows_ < 1) || (this->cols_ < 1)) ||
      (pCVar5 = (this->strides_).
                super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
                ._M_impl.super__Vector_impl_data._M_start, pCVar5->start != 0)) ||
     (pCVar3 = (this->strides_).
               super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
               ._M_impl.super__Vector_impl_data._M_finish, pCVar3[-1].end != this->cols_)) {
    bVar8 = false;
  }
  else {
    iVar7 = -1;
    iVar6 = -1;
    while ((bVar8 = pCVar5 == pCVar3, !bVar8 && (iVar1 = pCVar5->end, iVar7 <= iVar1))) {
      iVar2 = pCVar5->start;
      if (iVar1 <= iVar2) {
        return bVar8;
      }
      pCVar5 = pCVar5 + 1;
      bVar4 = iVar2 < iVar6;
      iVar7 = iVar1;
      iVar6 = iVar2;
      if (bVar4) {
        return bVar8;
      }
    }
  }
  return bVar8;
}

Assistant:

bool Window::IsValid() const {
  if (rows_ <= 0 || cols_ <= 0 || strides_.front().start != 0 ||
      strides_.back().end != cols_) {
    return false;
  }

  ColumnStride prev = {-1, -1};
  for (const auto& curr : strides_) {
    if (curr.end <= curr.start || curr.start < prev.start ||
        curr.end < prev.end) {
      return false;
    }
    prev = curr;
  }
  return true;
}